

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.hh
# Opt level: O2

GeomPrimvar * __thiscall tinyusdz::GeomPrimvar::operator=(GeomPrimvar *this,GeomPrimvar *rhs)

{
  std::__cxx11::string::_M_assign((string *)this);
  Attribute::operator=(&this->_attr,&rhs->_attr);
  std::vector<int,_std::allocator<int>_>::operator=(&this->_indices,&rhs->_indices);
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::operator=
            (&this->_ts_indices,&rhs->_ts_indices);
  this->_has_value = rhs->_has_value;
  if ((rhs->_elementSize).has_value_ == true) {
    nonstd::optional_lite::optional<unsigned_int>::operator=(&this->_elementSize,&rhs->_elementSize)
    ;
  }
  if ((rhs->_interpolation).has_value_ == true) {
    nonstd::optional_lite::optional<tinyusdz::Interpolation>::operator=
              (&this->_interpolation,&rhs->_interpolation);
  }
  nonstd::optional_lite::optional<int>::operator=
            (&this->_unauthoredValuesIndex,&rhs->_unauthoredValuesIndex);
  return this;
}

Assistant:

GeomPrimvar &operator=(const GeomPrimvar &rhs) {
    _name = rhs._name;
    _attr = rhs._attr;
    _indices = rhs._indices;
    _ts_indices = rhs._ts_indices;
    _has_value = rhs._has_value;
    if (rhs._elementSize) {
      _elementSize = rhs._elementSize;
    }

    if (rhs._interpolation) {
      _interpolation = rhs._interpolation;
    }
    _unauthoredValuesIndex = rhs._unauthoredValuesIndex;

    return *this;
  }